

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_port_map.c
# Opt level: O2

apx_bytePortMap_t *
apx_bytePortMap_new(apx_size_t total_size,apx_portInstance_t *port_instance_list,
                   apx_size_t num_ports,apx_error_t *errorCode)

{
  apx_error_t aVar1;
  apx_bytePortMap_t *self;
  
  self = (apx_bytePortMap_t *)malloc(0x10);
  if (self == (apx_bytePortMap_t *)0x0) {
    self = (apx_bytePortMap_t *)0x0;
  }
  else {
    aVar1 = apx_bytePortMap_create(self,total_size,port_instance_list,num_ports);
    if (aVar1 != 0) {
      free(self);
      self = (apx_bytePortMap_t *)0x0;
    }
    if (errorCode != (apx_error_t *)0x0) {
      *errorCode = aVar1;
    }
  }
  return self;
}

Assistant:

apx_bytePortMap_t* apx_bytePortMap_new(apx_size_t total_size, apx_portInstance_t const* port_instance_list, apx_size_t num_ports, apx_error_t* errorCode)
{
   apx_bytePortMap_t *self = (apx_bytePortMap_t*) malloc(sizeof(apx_bytePortMap_t));
   if (self != NULL)
   {
      apx_error_t result = apx_bytePortMap_create(self, total_size, port_instance_list, num_ports);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = (apx_bytePortMap_t*) NULL;
      }
      if (errorCode != 0)
      {
         *errorCode = result;
      }
   }
   return self;
}